

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ConvexCornerOption __thiscall
ON_SubDFromMeshParameters::GetConvexCornerOption(ON_SubDFromMeshParameters *this)

{
  ON_SubDFromMeshParameters *this_local;
  
  if (this->m_convex_corner_option < AtMeshCorner) {
    this_local._7_1_ = this->m_convex_corner_option;
  }
  else if ((((this->m_convex_corner_option != AtMeshCorner) ||
            (this->m_maximum_convex_corner_edge_count < 2)) ||
           (0xfff0 < this->m_maximum_convex_corner_edge_count)) ||
          ((this->m_maximum_convex_corner_angle_radians < 0.0 ||
           (3.141592653589793 < this->m_maximum_convex_corner_angle_radians ||
            this->m_maximum_convex_corner_angle_radians == 3.141592653589793)))) {
    this_local._7_1_ = Unset;
  }
  else {
    this_local._7_1_ = this->m_convex_corner_option;
  }
  return this_local._7_1_;
}

Assistant:

ON_SubDFromMeshParameters::ConvexCornerOption ON_SubDFromMeshParameters::GetConvexCornerOption() const
{
  switch (m_convex_corner_option)
  {
  case ON_SubDFromMeshParameters::ConvexCornerOption::Unset:
  case ON_SubDFromMeshParameters::ConvexCornerOption::None:
    return m_convex_corner_option;

  case ON_SubDFromMeshParameters::ConvexCornerOption::AtMeshCorner:
    if ( m_maximum_convex_corner_edge_count >= 2 
         && m_maximum_convex_corner_edge_count <= ON_SubDVertex::MaximumEdgeCount
         && m_maximum_convex_corner_angle_radians >= 0.0
         && m_maximum_convex_corner_angle_radians < ON_PI
         )
         return m_convex_corner_option;
    break;
  }

  return ON_SubDFromMeshParameters::ConvexCornerOption::Unset;
}